

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

void __thiscall
Assembler::processLdStrRegDir(Assembler *this,string *instruction,int reg,string operand)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (instruction->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + instruction->_M_string_length);
  instr3Bytes(this,&local_40,reg,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Assembler::processLdStrRegDir(string instruction, int reg, string operand) {
    int adr = 0x01;

    instr3Bytes(instruction, reg, adr);
    return;

}